

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O0

Var Js::JavascriptOperators::TypeofFld_Internal
              (Var instance,bool isRoot,PropertyId propertyId,ScriptContext *scriptContext)

{
  code *pcVar1;
  RecyclableObject *scriptContext_00;
  bool bVar2;
  BOOL BVar3;
  int iVar4;
  PropertyRecord *this;
  char16 *varName;
  JavascriptLibrary *this_00;
  undefined4 *puVar5;
  JavascriptException *err;
  undefined1 local_48 [8];
  AutoCatchHandlerExists autoCatchHandlerExists;
  Var value;
  RecyclableObject *object;
  ScriptContext *scriptContext_local;
  PropertyId propertyId_local;
  bool isRoot_local;
  Var instance_local;
  
  value = (Var)0x0;
  object = (RecyclableObject *)scriptContext;
  scriptContext_local._0_4_ = propertyId;
  scriptContext_local._7_1_ = isRoot;
  _propertyId_local = instance;
  BVar3 = GetPropertyObject(instance,scriptContext,(RecyclableObject **)&value);
  scriptContext_00 = object;
  if (BVar3 == 0) {
    this = ScriptContext::GetPropertyName((ScriptContext *)object,(PropertyId)scriptContext_local);
    varName = PropertyRecord::GetBuffer(this);
    JavascriptError::ThrowTypeError((ScriptContext *)scriptContext_00,-0x7ff5ec48,varName);
  }
  autoCatchHandlerExists.m_threadContext = (ThreadContext *)0x0;
  JavascriptExceptionOperators::AutoCatchHandlerExists::AutoCatchHandlerExists
            ((AutoCatchHandlerExists *)local_48,(ScriptContext *)object,true);
  if ((scriptContext_local._7_1_ & 1) == 0) {
    iVar4 = GetProperty(_propertyId_local,(RecyclableObject *)value,(PropertyId)scriptContext_local,
                        &autoCatchHandlerExists.m_threadContext,(ScriptContext *)object,
                        (PropertyValueInfo *)0x0);
  }
  else {
    iVar4 = GetRootProperty(_propertyId_local,(PropertyId)scriptContext_local,
                            &autoCatchHandlerExists.m_threadContext,(ScriptContext *)object,
                            (PropertyValueInfo *)0x0);
  }
  if (iVar4 == 0) {
    this_00 = ScriptContext::GetLibrary((ScriptContext *)object);
    instance_local = JavascriptLibrary::GetUndefinedDisplayString(this_00);
    bVar2 = true;
  }
  else {
    bVar2 = ScriptContext::IsUndeclBlockVar
                      ((ScriptContext *)object,autoCatchHandlerExists.m_threadContext);
    if (bVar2) {
      bVar2 = false;
    }
    else {
      instance_local = Typeof(autoCatchHandlerExists.m_threadContext,(ScriptContext *)object);
      bVar2 = true;
    }
  }
  JavascriptExceptionOperators::AutoCatchHandlerExists::~AutoCatchHandlerExists
            ((AutoCatchHandlerExists *)local_48);
  if (!bVar2) {
    bVar2 = ScriptContext::IsUndeclBlockVar
                      ((ScriptContext *)object,autoCatchHandlerExists.m_threadContext);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                  ,0x189,"(scriptContext->IsUndeclBlockVar(value))",
                                  "scriptContext->IsUndeclBlockVar(value)");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
    JavascriptError::ThrowReferenceError((ScriptContext *)object,-0x7ff5ec07,(PCWSTR)0x0);
  }
  return instance_local;
}

Assistant:

Var JavascriptOperators::TypeofFld_Internal(Var instance, const bool isRoot, PropertyId propertyId, ScriptContext* scriptContext)
    {
        RecyclableObject* object = nullptr;
        if (FALSE == JavascriptOperators::GetPropertyObject(instance, scriptContext, &object))
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_Property_CannotGet_NullOrUndefined , scriptContext->GetPropertyName(propertyId)->GetBuffer());
        }

        Var value = nullptr;
        try
        {
            Js::JavascriptExceptionOperators::AutoCatchHandlerExists autoCatchHandlerExists(scriptContext);

            // In edge mode, spec compat is more important than backward compat. Use spec/web behavior here
            if (isRoot
                    ? !JavascriptOperators::GetRootProperty(instance, propertyId, &value, scriptContext)
                    : !JavascriptOperators::GetProperty(instance, object, propertyId, &value, scriptContext))
            {
                return scriptContext->GetLibrary()->GetUndefinedDisplayString();
            }
            if (!scriptContext->IsUndeclBlockVar(value))
            {
                return JavascriptOperators::Typeof(value, scriptContext);
            }
        }
        catch(const JavascriptException& err)
        {
            err.GetAndClear();  // discard exception object
            return scriptContext->GetLibrary()->GetUndefinedDisplayString();
        }

        Assert(scriptContext->IsUndeclBlockVar(value));
        JavascriptError::ThrowReferenceError(scriptContext, JSERR_UseBeforeDeclaration);
    }